

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void MatchFinder_Construct(CMatchFinder *p)

{
  uint local_1c;
  uint local_18;
  uint j;
  UInt32 r;
  uint i;
  CMatchFinder *p_local;
  
  p->buffer = (Byte *)0x0;
  p->bufBase = (Byte *)0x0;
  p->directInput = '\0';
  p->stream = (ISeqInStreamPtr)0x0;
  p->hash = (CLzRef *)0x0;
  p->expectedDataSize = 0xffffffffffffffff;
  MatchFinder_SetDefaultSettings(p);
  for (j = 0; j < 0x100; j = j + 1) {
    local_18 = j;
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      local_18 = local_18 >> 1 ^ -(local_18 & 1) & 0xedb88320;
    }
    p->crc[j] = local_18;
  }
  return;
}

Assistant:

void MatchFinder_Construct(CMatchFinder *p)
{
  unsigned i;
  p->buffer = NULL;
  p->bufBase = NULL;
  p->directInput = 0;
  p->stream = NULL;
  p->hash = NULL;
  p->expectedDataSize = (UInt64)(Int64)-1;
  MatchFinder_SetDefaultSettings(p);

  for (i = 0; i < 256; i++)
  {
    UInt32 r = (UInt32)i;
    unsigned j;
    for (j = 0; j < 8; j++)
      r = (r >> 1) ^ (kCrcPoly & ((UInt32)0 - (r & 1)));
    p->crc[i] = r;
  }
}